

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
::remove_values(btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                *this,field_type i,field_type to_erase,allocator_type *alloc)

{
  byte bVar1;
  bool bVar2;
  btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
  *pbVar3;
  template_ElementType<2UL> *ptVar4;
  uint uVar5;
  undefined7 in_register_00000031;
  field_type fVar6;
  int iVar7;
  
  value_destroy_n(this,i,to_erase,alloc);
  bVar1 = finish(this);
  iVar7 = (int)CONCAT71(in_register_00000031,i);
  uVar5 = (uint)to_erase + iVar7 & 0xff;
  transfer_n(this,(long)(int)(bVar1 - uVar5),CONCAT71(in_register_00000031,i) & 0xffffffff,
             (ulong)uVar5,this,alloc);
  bVar2 = is_internal(this);
  if (bVar2) {
    uVar5 = iVar7 + 1;
    fVar6 = to_erase;
    while (bVar2 = fVar6 != '\0', fVar6 = fVar6 + 0xff, bVar2) {
      pbVar3 = child(this,(field_type)uVar5);
      clear_and_delete(pbVar3,alloc);
      uVar5 = (uint)(byte)((field_type)uVar5 + 1);
    }
    while( true ) {
      i = i + '\x01';
      if (bVar1 < (byte)(to_erase + i)) break;
      pbVar3 = child(this,to_erase + i);
      set_child(this,i,pbVar3);
      btree_node<absl::lts_20240722::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
      ::GetField<4ul>((btree_node<absl::lts_20240722::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
                       *)this);
    }
  }
  ptVar4 = btree_node<absl::lts_20240722::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
           ::GetField<2ul>((btree_node<absl::lts_20240722::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>
                            *)this);
  ptVar4[2] = bVar1 - to_erase;
  return;
}

Assistant:

inline void btree_node<P>::remove_values(const field_type i,
                                         const field_type to_erase,
                                         allocator_type *alloc) {
  // Transfer values after the removed range into their new places.
  value_destroy_n(i, to_erase, alloc);
  const field_type orig_finish = finish();
  const field_type src_i = i + to_erase;
  transfer_n(orig_finish - src_i, i, src_i, this, alloc);

  if (is_internal()) {
    // Delete all children between begin and end.
    for (field_type j = 0; j < to_erase; ++j) {
      clear_and_delete(child(i + j + 1), alloc);
    }
    // Rotate children after end into new positions.
    for (field_type j = i + to_erase + 1; j <= orig_finish; ++j) {
      set_child(j - to_erase, child(j));
      clear_child(j);
    }
  }
  set_finish(orig_finish - to_erase);
}